

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall SymmetricAlgorithm::isStreamCipher(SymmetricAlgorithm *this)

{
  Type TVar1;
  SymmetricAlgorithm *this_local;
  bool local_1;
  
  TVar1 = this->currentCipherMode;
  if ((TVar1 - CFB < 2) || (TVar1 == GCM || TVar1 == OFB)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SymmetricAlgorithm::isStreamCipher()
{
	switch (currentCipherMode)
	{
		case SymMode::CFB:
		case SymMode::CTR:
		case SymMode::GCM:
		case SymMode::OFB:
			return true;
		default:
			break;
	}

	return false;
}